

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  bool bVar1;
  CppType CVar2;
  int32_t x;
  uint32_t x_00;
  Type TVar3;
  FieldDescriptor *this_00;
  int64_t x_01;
  uint64_t x_02;
  char *__s;
  EnumValueDescriptor *this_01;
  LogMessage *pLVar4;
  uint *puVar5;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *in_R8;
  float value;
  double value_00;
  string_view src;
  string_view src_00;
  LogMessage local_238;
  Voidify local_221;
  LogMessage local_220;
  Voidify local_20a;
  allocator<char> local_209;
  string_view local_208;
  allocator<char> local_1f1;
  string_view local_1f0;
  string_view local_1e0;
  AlphaNum local_1d0;
  string_view local_1a0;
  string local_190;
  AlphaNum local_170;
  AlphaNum local_140;
  allocator<char> local_109;
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  byte local_31;
  LogMessage local_30;
  Voidify local_1a;
  byte local_19;
  FieldDescriptor *pFStack_18;
  bool quote_string_type_local;
  FieldDescriptor *this_local;
  
  this_00 = this;
  local_19 = quote_string_type;
  pFStack_18 = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = has_default_value(this);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc0a,"has_default_value()");
    local_31 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    this_00 = (FieldDescriptor *)
              absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar4,(char (*) [17])"No default value");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1a,(LogMessage *)this_00);
  }
  if ((local_31 & 1) == 0) {
    CVar2 = cpp_type(this);
    puVar5 = &switchD_002dffad::switchdataD_00756a90;
    switch(CVar2) {
    case CPPTYPE_INT32:
      x = default_value_int32_t(this);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_78,x);
      absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_78,a);
      break;
    case CPPTYPE_INT64:
      x_01 = default_value_int64_t(this);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,x_01);
      absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_a8,a_00);
      break;
    case CPPTYPE_UINT32:
      x_00 = default_value_uint32_t(this);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,x_00);
      absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_d8,a_01);
      break;
    case CPPTYPE_UINT64:
      x_02 = default_value_uint64_t(this);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_108,x_02);
      absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_108,a_02);
      break;
    case CPPTYPE_DOUBLE:
      value_00 = default_value_double(this);
      io::SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(io *)this_00,value_00);
      break;
    case CPPTYPE_FLOAT:
      value = default_value_float(this);
      io::SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(io *)this_00,value);
      break;
    case CPPTYPE_BOOL:
      bVar1 = default_value_bool(this);
      __s = "false";
      if (bVar1) {
        __s = "true";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_109);
      std::allocator<char>::~allocator(&local_109);
      break;
    case CPPTYPE_ENUM:
      this_01 = default_value_enum(this);
      local_208 = EnumValueDescriptor::name(this_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&local_208,&local_209);
      std::allocator<char>::~allocator(&local_209);
      break;
    case CPPTYPE_STRING:
      if ((local_19 & 1) == 0) {
        TVar3 = type(this);
        if (TVar3 == TYPE_BYTES) {
          local_1e0 = default_value_string(this);
          src_00._M_str = (char *)puVar5;
          src_00._M_len = (size_t)local_1e0._M_str;
          absl::lts_20250127::CEscape_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)local_1e0._M_len,src_00);
        }
        else {
          local_1f0 = default_value_string(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)__return_storage_ptr__,&local_1f0,&local_1f1);
          std::allocator<char>::~allocator(&local_1f1);
        }
      }
      else {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_140,"\"");
        local_1a0 = default_value_string(this);
        src._M_str = (char *)puVar5;
        src._M_len = (size_t)local_1a0._M_str;
        absl::lts_20250127::CEscape_abi_cxx11_(&local_190,(lts_20250127 *)local_1a0._M_len,src);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_170,&local_190);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1d0,"\"");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_140,&local_170,&local_1d0,in_R8);
        std::__cxx11::string::~string((string *)&local_190);
      }
      break;
    case CPPTYPE_MESSAGE:
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_220,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0xc27);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_220);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [36])"Messages can\'t have default values!");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_20a,pLVar4);
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_220);
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0xc2a);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_238);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [54])
                                 "Can\'t get here: failed to get default value as string");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_221,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_238);
    }
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  ABSL_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return absl::StrCat(default_value_int32_t());
    case CPPTYPE_INT64:
      return absl::StrCat(default_value_int64_t());
    case CPPTYPE_UINT32:
      return absl::StrCat(default_value_uint32_t());
    case CPPTYPE_UINT64:
      return absl::StrCat(default_value_uint64_t());
    case CPPTYPE_FLOAT:
      return io::SimpleFtoa(default_value_float());
    case CPPTYPE_DOUBLE:
      return io::SimpleDtoa(default_value_double());
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return absl::StrCat("\"", absl::CEscape(default_value_string()), "\"");
      } else {
        if (type() == TYPE_BYTES) {
          return absl::CEscape(default_value_string());
        } else {
          return std::string(default_value_string());
        }
      }
    case CPPTYPE_ENUM:
      return std::string(default_value_enum()->name());
    case CPPTYPE_MESSAGE:
      ABSL_DLOG(FATAL) << "Messages can't have default values!";
      break;
  }
  ABSL_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}